

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_contracthashutil.cpp
# Opt level: O0

void __thiscall
ContractHashUtil_GetContractScriptOpTrue_Test::TestBody
          (ContractHashUtil_GetContractScriptOpTrue_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_1a8;
  Message local_1a0;
  string local_198;
  undefined1 local_178 [8];
  AssertionResult gtest_ar;
  Message local_160 [2];
  Script local_150;
  undefined1 local_118 [8];
  Script script;
  string local_d8;
  undefined1 local_b8 [8];
  Script fedpeg_script;
  allocator local_69;
  string local_68;
  undefined1 local_48 [8];
  Script claim_script;
  ContractHashUtil_GetContractScriptOpTrue_Test *this_local;
  
  claim_script.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_68,"0014fd1cd5452a43ca210ba7153d64227dc32acf6dbb",&local_69);
  cfd::core::Script::Script((Script *)local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d8,"51",
             (allocator *)
             ((long)&script.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Script::Script((Script *)local_b8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&script.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Script::Script((Script *)local_118);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ContractHashUtil::GetContractScript
                (&local_150,(Script *)local_48,(Script *)local_b8);
      cfd::core::Script::operator=((Script *)local_118,&local_150);
      cfd::core::Script::~Script(&local_150);
    }
  }
  else {
    testing::Message::Message(local_160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_contracthashutil.cpp"
               ,0x3b,
               "Expected: (script = ContractHashUtil::GetContractScript(claim_script, fedpeg_script)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(local_160);
  }
  cfd::core::Script::GetHex_abi_cxx11_(&local_198,(Script *)local_118);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_178,"script.GetHex().c_str()","\"51\"",pcVar2,"51");
  std::__cxx11::string::~string((string *)&local_198);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_contracthashutil.cpp"
               ,0x3c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  cfd::core::Script::~Script((Script *)local_118);
  cfd::core::Script::~Script((Script *)local_b8);
  cfd::core::Script::~Script((Script *)local_48);
  return;
}

Assistant:

TEST(ContractHashUtil, GetContractScriptOpTrue) {
  Script claim_script("0014fd1cd5452a43ca210ba7153d64227dc32acf6dbb");
  Script fedpeg_script("51");  // OP_TRUE
  Script script;
  EXPECT_NO_THROW(
      (script = ContractHashUtil::GetContractScript(claim_script,
          fedpeg_script)));
  EXPECT_STREQ(script.GetHex().c_str(), "51");
}